

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_util.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* anon_unknown.dwarf_47cf2::split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,size_t pos)

{
  long local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long local_48;
  size_type size;
  size_type end;
  size_type start;
  char *local_28;
  char *anySpace;
  size_t pos_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  local_28 = " \t\r\n\v\f";
  start._7_1_ = 0;
  anySpace = (char *)pos;
  pos_local = (size_t)str;
  str_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while ((anySpace != (char *)0xffffffffffffffff &&
         (end = std::__cxx11::string::find_first_not_of((char *)pos_local,0x20f113),
         end != 0xffffffffffffffff))) {
    size = std::__cxx11::string::find_first_of((char *)pos_local,0x20f113);
    if (size == 0xffffffffffffffff) {
      local_90 = -1;
    }
    else {
      local_90 = size - end;
    }
    local_48 = local_90;
    std::__cxx11::string::substr((ulong)&local_68,pos_local);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    anySpace = (char *)size;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split(std::string const& str, size_t pos = 0)
	{
		const char* const anySpace = " \t\r\n\v\f";

		std::vector<std::string> ret;
		while (pos != std::string::npos) {
			auto start = str.find_first_not_of(anySpace, pos);
			if (start == std::string::npos) break;

			auto end = str.find_first_of(anySpace, start);
			auto size = end==std::string::npos ? end : end-start;
			ret.emplace_back(str.substr(start, size));

			pos = end;
		}

		return ret;
	}